

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation_statistics_helper.cpp
# Opt level: O3

RelationStats *
duckdb::RelationStatisticsHelper::ExtractDelimGetStats
          (RelationStats *__return_storage_ptr__,LogicalDelimGet *delim_get,ClientContext *context)

{
  pointer *ppDVar1;
  iterator __position;
  ulong __val;
  bool bVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  long *plVar5;
  ulong uVar6;
  size_type *psVar7;
  char cVar8;
  void *pvVar9;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  char *local_70;
  uint local_68;
  char local_60 [16];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_50;
  void *local_48;
  void *local_40;
  
  (__return_storage_ptr__->column_distinct_count).
  super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
  super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->column_distinct_count).
  super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
  super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->column_distinct_count).
  super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
  super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__->cardinality = 1;
  __return_storage_ptr__->filter_strength = 1.0;
  __return_storage_ptr__->stats_initialized = false;
  (__return_storage_ptr__->column_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->column_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->column_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->table_name)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->table_name).field_2;
  (__return_storage_ptr__->table_name)._M_string_length = 0;
  (__return_storage_ptr__->table_name).field_2._M_local_buf[0] = '\0';
  (*(delim_get->super_LogicalOperator)._vptr_LogicalOperator[3])(&local_90);
  ::std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->table_name,(string *)&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  iVar4 = (*(delim_get->super_LogicalOperator)._vptr_LogicalOperator[7])(delim_get,context);
  __return_storage_ptr__->cardinality = CONCAT44(extraout_var,iVar4);
  __return_storage_ptr__->stats_initialized = true;
  (*(delim_get->super_LogicalOperator)._vptr_LogicalOperator[2])(&local_48,delim_get);
  if (local_48 != local_40) {
    local_50 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &__return_storage_ptr__->column_names;
    pvVar9 = local_48;
    do {
      local_90._M_dataplus._M_p = &DAT_00000001;
      local_90._M_string_length = local_90._M_string_length & 0xffffffffffffff00;
      __position._M_current =
           (__return_storage_ptr__->column_distinct_count).
           super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
           super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->column_distinct_count).
          super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
          super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>::
        _M_realloc_insert<duckdb::DistinctCount>
                  ((vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_> *)
                   __return_storage_ptr__,__position,(DistinctCount *)&local_90);
      }
      else {
        (__position._M_current)->distinct_count = 1;
        *(size_type *)&(__position._M_current)->from_hll = local_90._M_string_length;
        ppDVar1 = &(__return_storage_ptr__->column_distinct_count).
                   super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                   super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppDVar1 = *ppDVar1 + 1;
      }
      __val = *(ulong *)((long)pvVar9 + 8);
      cVar8 = '\x01';
      if (9 < __val) {
        uVar6 = __val;
        cVar3 = '\x04';
        do {
          cVar8 = cVar3;
          if (uVar6 < 100) {
            cVar8 = cVar8 + -2;
            goto LAB_01746fb4;
          }
          if (uVar6 < 1000) {
            cVar8 = cVar8 + -1;
            goto LAB_01746fb4;
          }
          if (uVar6 < 10000) goto LAB_01746fb4;
          bVar2 = 99999 < uVar6;
          uVar6 = uVar6 / 10000;
          cVar3 = cVar8 + '\x04';
        } while (bVar2);
        cVar8 = cVar8 + '\x01';
      }
LAB_01746fb4:
      local_70 = local_60;
      ::std::__cxx11::string::_M_construct((ulong)&local_70,cVar8);
      ::std::__detail::__to_chars_10_impl<unsigned_long>(local_70,local_68,__val);
      plVar5 = (long *)::std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x1e11640);
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_90.field_2._M_allocated_capacity = *psVar7;
        local_90.field_2._8_8_ = plVar5[3];
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar7;
        local_90._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_90._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_50,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if (local_70 != local_60) {
        operator_delete(local_70);
      }
      pvVar9 = (void *)((long)pvVar9 + 0x10);
    } while (pvVar9 != local_40);
  }
  if (local_48 != (void *)0x0) {
    operator_delete(local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

RelationStats RelationStatisticsHelper::ExtractDelimGetStats(LogicalDelimGet &delim_get, ClientContext &context) {
	RelationStats stats;
	stats.table_name = delim_get.GetName();
	idx_t card = delim_get.EstimateCardinality(context);
	stats.cardinality = card;
	stats.stats_initialized = true;
	for (auto &binding : delim_get.GetColumnBindings()) {
		stats.column_distinct_count.push_back(DistinctCount({1, false}));
		stats.column_names.push_back("column" + to_string(binding.column_index));
	}
	return stats;
}